

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O2

void __thiscall arangodb::velocypack::Builder::addUInt(Builder *this,uint64_t v)

{
  if (v < 10) {
    appendByte(this,(byte)v | 0x30);
    return;
  }
  appendUInt(this,v,'\'');
  return;
}

Assistant:

void addUInt(uint64_t v) {
    if (v <= 9) {
      // SmallInt
      appendByte(static_cast<uint8_t>(0x30 + v));
    } else {
      // regular UInt
      appendUInt(v, 0x27);
    }
  }